

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O1

void __thiscall
llvm::yaml::IO::processKey<llvm::dwarf::Form,llvm::yaml::EmptyContext>
          (IO *this,char *Key,Form *Val,bool Required,EmptyContext *Ctx)

{
  int iVar1;
  undefined7 in_register_00000009;
  undefined8 local_28;
  void *SaveInfo;
  bool UseDefault;
  
  iVar1 = (*this->_vptr_IO[0xf])
                    (this,Key,CONCAT71(in_register_00000009,Required) & 0xffffffff,0,
                     (long)&SaveInfo + 7,&local_28);
  if ((char)iVar1 != '\0') {
    (*this->_vptr_IO[0x14])(this);
    ScalarEnumerationTraits<llvm::dwarf::Form,_void>::enumeration(this,Val);
    (*this->_vptr_IO[0x17])(this);
    (*this->_vptr_IO[0x10])(this,local_28);
  }
  return;
}

Assistant:

void processKey(const char *Key, T &Val, bool Required, Context &Ctx) {
    void *SaveInfo;
    bool UseDefault;
    if ( this->preflightKey(Key, Required, false, UseDefault, SaveInfo) ) {
      yamlize(*this, Val, Required, Ctx);
      this->postflightKey(SaveInfo);
    }
  }